

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RelativeDateFormat::toPattern
          (RelativeDateFormat *this,UnicodeString *result,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString *__filename;
  UErrorCode *status_local;
  UnicodeString *result_local;
  RelativeDateFormat *this_local;
  
  __filename = result;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::remove(result,(char *)__filename);
    UVar1 = icu_63::UnicodeString::isEmpty(&this->fDatePattern);
    if (UVar1 == '\0') {
      UVar1 = icu_63::UnicodeString::isEmpty(&this->fTimePattern);
      if ((UVar1 == '\0') && (this->fCombinedFormat != (SimpleFormatter *)0x0)) {
        SimpleFormatter::format
                  (this->fCombinedFormat,&this->fTimePattern,&this->fDatePattern,result,status);
      }
      else {
        icu_63::UnicodeString::setTo(result,&this->fDatePattern);
      }
    }
    else {
      icu_63::UnicodeString::setTo(result,&this->fTimePattern);
    }
  }
  return result;
}

Assistant:

UnicodeString&
RelativeDateFormat::toPattern(UnicodeString& result, UErrorCode& status) const
{
    if (!U_FAILURE(status)) {
        result.remove();
        if (fDatePattern.isEmpty()) {
            result.setTo(fTimePattern);
        } else if (fTimePattern.isEmpty() || fCombinedFormat == NULL) {
            result.setTo(fDatePattern);
        } else {
            fCombinedFormat->format(fTimePattern, fDatePattern, result, status);
        }
    }
    return result;
}